

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

void luaH_free(lua_State *L,Table *t)

{
  freehash(L,t);
  resizearray(L,t,t->asize,0);
  luaM_free_(L,t,0x30);
  return;
}

Assistant:

void luaH_free (lua_State *L, Table *t) {
  freehash(L, t);
  resizearray(L, t, t->asize, 0);
  luaM_free(L, t);
}